

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_CDict *
ZSTD_initStaticCDict
          (void *workspace,size_t workspaceSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
          ZSTD_compressionParameters cParams)

{
  ZSTD_CDict *cdict;
  size_t sVar1;
  long lVar2;
  ZSTD_cwksp *pZVar3;
  undefined8 *puVar4;
  ZSTD_useRowMatchFinderMode_e useRowMatchFinder;
  byte bVar5;
  ZSTD_CCtx_params in_stack_fffffffffffffe48;
  ZSTD_cwksp local_e0 [2];
  ZSTD_useRowMatchFinderMode_e local_50;
  
  bVar5 = 0;
  useRowMatchFinder = ZSTD_urm_enableRowMatchFinder - (cParams.windowLog < 0xf);
  if (cParams.strategy - ZSTD_btlazy2 < 0xfffffffd) {
    useRowMatchFinder = ZSTD_urm_disableRowMatchFinder;
  }
  sVar1 = ZSTD_sizeof_matchState(&cParams,useRowMatchFinder,1,0);
  lVar2 = (dictSize + 7 & 0xfffffffffffffff8) + 0x2c90;
  if (dictLoadMethod == ZSTD_dlm_byRef) {
    lVar2 = 0x2c90;
  }
  if ((((ulong)workspace & 7) == 0) &&
     (ZSTD_cwksp_init(local_e0,workspace,workspaceSize,ZSTD_cwksp_static_alloc),
     local_e0[0].phase == ZSTD_cwksp_alloc_objects)) {
    cdict = (ZSTD_CDict *)CONCAT44(local_e0[0].objectEnd._4_4_,(uint)local_e0[0].objectEnd);
    local_e0[0].tableEnd = cdict + 1;
    if ((local_e0[0].tableEnd <=
         (ZSTD_CDict *)CONCAT44(local_e0[0].workspaceEnd._4_4_,(uint)local_e0[0].workspaceEnd)) &&
       (cdict != (ZSTD_CDict *)0x0)) {
      (cdict->workspace).allocFailed = local_e0[0].allocFailed;
      *(undefined3 *)&(cdict->workspace).field_0x31 = local_e0[0]._49_3_;
      (cdict->workspace).workspaceOversizedDuration = local_e0[0].workspaceOversizedDuration;
      (cdict->workspace).phase = (int)((ulong)local_e0[0].isStatic << 0x20);
      (cdict->workspace).isStatic = (int)(((ulong)local_e0[0].isStatic << 0x20) >> 0x20);
      (cdict->workspace).tableValidEnd = local_e0[0].tableEnd;
      (cdict->workspace).allocStart = local_e0[0].allocStart;
      (cdict->workspace).objectEnd = local_e0[0].tableEnd;
      (cdict->workspace).tableEnd = local_e0[0].tableEnd;
      (cdict->workspace).workspace =
           (void *)CONCAT44(local_e0[0].workspace._4_4_,local_e0[0].workspace._0_4_);
      (cdict->workspace).workspaceEnd =
           (void *)CONCAT44(local_e0[0].workspaceEnd._4_4_,(uint)local_e0[0].workspaceEnd);
      if (sVar1 + lVar2 <= workspaceSize) {
        local_e0[0].tableValidEnd = local_e0[0].tableEnd;
        local_e0[0].objectEnd = local_e0[0].tableEnd;
        memset(local_e0,0,0xb0);
        local_e0[0].tableValidEnd = (void *)CONCAT44(local_e0[0].tableValidEnd._4_4_,1);
        local_e0[0].workspace._4_4_ = cParams.windowLog;
        local_e0[0].workspaceEnd._0_4_ = cParams.chainLog;
        local_e0[0].workspaceEnd._4_4_ = cParams.hashLog;
        local_e0[0].objectEnd._0_4_ = cParams.searchLog;
        local_e0[0].objectEnd._4_4_ = cParams.minMatch;
        local_e0[0].tableEnd = (void *)CONCAT44(cParams.strategy,cParams.targetLength);
        local_50 = useRowMatchFinder;
        cdict->useRowMatchFinder = useRowMatchFinder;
        pZVar3 = local_e0;
        puVar4 = (undefined8 *)&stack0xfffffffffffffe48;
        for (lVar2 = 0x16; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar4 = pZVar3->workspace;
          pZVar3 = (ZSTD_cwksp *)((long)pZVar3 + ((ulong)bVar5 * -2 + 1) * 8);
          puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
        }
        sVar1 = ZSTD_initCDict_internal
                          (cdict,dict,dictSize,dictLoadMethod,dictContentType,
                           in_stack_fffffffffffffe48);
        if (0xffffffffffffff88 < sVar1) {
          return (ZSTD_CDict *)0x0;
        }
        return cdict;
      }
    }
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

const ZSTD_CDict* ZSTD_initStaticCDict(
                                 void* workspace, size_t workspaceSize,
                           const void* dict, size_t dictSize,
                                 ZSTD_dictLoadMethod_e dictLoadMethod,
                                 ZSTD_dictContentType_e dictContentType,
                                 ZSTD_compressionParameters cParams)
{
    ZSTD_useRowMatchFinderMode_e const useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(ZSTD_urm_auto, &cParams);
    /* enableDedicatedDictSearch == 1 ensures matchstate is not too small in case this CDict will be used for DDS + row hash */
    size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, useRowMatchFinder, /* enableDedicatedDictSearch */ 1, /* forCCtx */ 0);
    size_t const neededSize = ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict))
                            + (dictLoadMethod == ZSTD_dlm_byRef ? 0
                               : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void*))))
                            + ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE)
                            + matchStateSize;
    ZSTD_CDict* cdict;
    ZSTD_CCtx_params params;

    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */

    {
        ZSTD_cwksp ws;
        ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);
        cdict = (ZSTD_CDict*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CDict));
        if (cdict == NULL) return NULL;
        ZSTD_cwksp_move(&cdict->workspace, &ws);
    }

    DEBUGLOG(4, "(workspaceSize < neededSize) : (%u < %u) => %u",
        (unsigned)workspaceSize, (unsigned)neededSize, (unsigned)(workspaceSize < neededSize));
    if (workspaceSize < neededSize) return NULL;

    ZSTD_CCtxParams_init(&params, 0);
    params.cParams = cParams;
    params.useRowMatchFinder = useRowMatchFinder;
    cdict->useRowMatchFinder = useRowMatchFinder;

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                              dict, dictSize,
                                              dictLoadMethod, dictContentType,
                                              params) ))
        return NULL;

    return cdict;
}